

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

DirectorySnapshotDiff * __thiscall
efsw::DirectorySnapshot::scan(DirectorySnapshotDiff *__return_storage_ptr__,DirectorySnapshot *this)

{
  FileInfoMap *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__k;
  bool bVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  FileInfoList *pFVar7;
  DirectorySnapshotDiff *this_01;
  _Self __tmp_1;
  _Self __tmp;
  string oldFile;
  FileInfoMap FilesCpy;
  FileInfoMap files;
  FileInfo curFI;
  FileInfo fi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  local_1a8;
  string local_178;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  local_158;
  FileInfo local_128;
  FileInfo local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
  local_98;
  
  memset(__return_storage_ptr__,0,0xc0);
  DirectorySnapshotDiff::clear(__return_storage_ptr__);
  FileInfo::FileInfo(&local_128,(string *)this);
  bVar2 = FileInfo::operator!=(&this->DirectoryInfo,&local_128);
  __return_storage_ptr__->DirChanged = bVar2;
  if (bVar2) {
    FileInfo::operator=(&this->DirectoryInfo,&local_128);
  }
  bVar2 = FileInfo::exists(&local_128);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_178,(string *)this);
    FileSystem::filesInfoFromPath((FileInfoMap *)&local_158,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    if ((this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
        local_158._M_impl.super__Rb_tree_header._M_node_count != 0) {
      FileInfo::FileInfo(&local_e0);
      local_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1a8._M_impl.super__Rb_tree_header._M_header;
      local_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (__return_storage_ptr__->DirChanged == true) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ::operator=(&local_1a8,&(this->Files)._M_t);
      }
      this_00 = &this->Files;
      p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
      for (p_Var6 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &local_158._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        FileInfo::operator=(&local_e0,(FileInfo *)(p_Var6 + 2));
        __k = p_Var6 + 1;
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                ::find(&this_00->_M_t,(key_type *)__k);
        if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
          bVar2 = FileInfo::isRegularFile(&local_e0);
          if (!bVar2) {
            bVar2 = FileInfo::isDirectory(&local_e0);
            if (!bVar2) goto LAB_00110ce9;
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                   ::operator[](this_00,(key_type *)__k);
          FileInfo::operator=(pmVar4,&local_e0);
          std::__cxx11::string::string((string *)&local_1c8,"",(allocator *)&local_98);
          iVar5 = nodeInFiles_abi_cxx11_(this,&local_e0);
          if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
            bVar2 = FileInfo::isDirectory(&local_e0);
            pFVar7 = &__return_storage_ptr__->FilesCreated;
            if (bVar2) {
              pFVar7 = &__return_storage_ptr__->DirsCreated;
            }
            std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                      (pFVar7,&local_e0);
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_1c8);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            ::erase(&local_1a8,(key_type *)(iVar5._M_node + 1));
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            ::erase(&this_00->_M_t,(key_type *)(iVar5._M_node + 1));
            bVar2 = FileInfo::isDirectory(&local_e0);
            if (bVar2) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_efsw::FileInfo_&,_true>
                        (&local_98,&local_1c8,&local_e0);
              std::
              vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
              ::emplace_back<std::pair<std::__cxx11::string,efsw::FileInfo>>
                        ((vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
                          *)&__return_storage_ptr__->DirsMoved,&local_98);
            }
            else {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_efsw::FileInfo_&,_true>
                        (&local_98,&local_1c8,&local_e0);
              std::
              vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
              ::emplace_back<std::pair<std::__cxx11::string,efsw::FileInfo>>
                        ((vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
                          *)&__return_storage_ptr__->FilesMoved,&local_98);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
            ::~pair(&local_98);
          }
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
          ::erase(&local_1a8,(key_type *)__k);
          bVar2 = FileInfo::operator!=((FileInfo *)(iVar3._M_node + 2),&local_e0);
          if (bVar2) {
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     ::operator[](this_00,(key_type *)__k);
            FileInfo::operator=(pmVar4,&local_e0);
            bVar2 = FileInfo::isDirectory(&local_e0);
            pFVar7 = &__return_storage_ptr__->FilesModified;
            if (bVar2) {
              pFVar7 = &__return_storage_ptr__->DirsModified;
            }
            std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                      (pFVar7,&local_e0);
          }
        }
LAB_00110ce9:
      }
      if (__return_storage_ptr__->DirChanged == true) {
        for (p_Var6 = local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_1a8._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          FileInfo::operator=(&local_e0,(FileInfo *)(p_Var6 + 2));
          bVar2 = FileInfo::isDirectory(&local_e0);
          this_01 = __return_storage_ptr__;
          if (bVar2) {
            this_01 = (DirectorySnapshotDiff *)&__return_storage_ptr__->DirsDeleted;
          }
          std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                    (&this_01->FilesDeleted,&local_e0);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
          ::erase(&this_00->_M_t,(key_type *)(p_Var6 + 1));
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
      ::~_Rb_tree(&local_1a8);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~_Rb_tree(&local_158);
  }
  else {
    deleteAll(this,__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_128);
  return __return_storage_ptr__;
}

Assistant:

DirectorySnapshotDiff DirectorySnapshot::scan() {
	DirectorySnapshotDiff Diff;

	Diff.clear();

	FileInfo curFI( DirectoryInfo.Filepath );

	Diff.DirChanged = DirectoryInfo != curFI;

	if ( Diff.DirChanged ) {
		DirectoryInfo = curFI;
	}

	/// If the directory was erased, create the events for files and directories deletion
	if ( !curFI.exists() ) {
		deleteAll( Diff );

		return Diff;
	}

	FileInfoMap files = FileSystem::filesInfoFromPath( DirectoryInfo.Filepath );

	if ( files.empty() && Files.empty() ) {
		return Diff;
	}

	FileInfo fi;
	FileInfoMap FilesCpy;
	FileInfoMap::iterator it;
	FileInfoMap::iterator fiIt;

	if ( Diff.DirChanged ) {
		FilesCpy = Files;
	}

	for ( it = files.begin(); it != files.end(); it++ ) {
		fi = it->second;

		/// File existed before?
		fiIt = Files.find( it->first );

		if ( fiIt != Files.end() ) {
			/// Erase from the file list copy
			FilesCpy.erase( it->first );

			/// File changed?
			if ( ( *fiIt ).second != fi ) {
				/// Update the new file info
				Files[it->first] = fi;

				/// handle modified event
				if ( fi.isDirectory() ) {
					Diff.DirsModified.push_back( fi );
				} else {
					Diff.FilesModified.push_back( fi );
				}
			}
		}
		/// Only add regular files or directories
		else if ( fi.isRegularFile() || fi.isDirectory() ) {
			/// New file found
			Files[it->first] = fi;

			FileInfoMap::iterator fit;
			std::string oldFile = "";

			/// Check if the same inode already existed
			if ( ( fit = nodeInFiles( fi ) ) != Files.end() ) {
				oldFile = fit->first;

				/// Avoid firing a Delete event
				FilesCpy.erase( fit->first );

				/// Delete the old file name
				Files.erase( fit->first );

				if ( fi.isDirectory() ) {
					Diff.DirsMoved.push_back( std::make_pair( oldFile, fi ) );
				} else {
					Diff.FilesMoved.push_back( std::make_pair( oldFile, fi ) );
				}
			} else {
				if ( fi.isDirectory() ) {
					Diff.DirsCreated.push_back( fi );
				} else {
					Diff.FilesCreated.push_back( fi );
				}
			}
		}
	}

	if ( !Diff.DirChanged ) {
		return Diff;
	}

	/// The files or directories that remains were deleted
	for ( it = FilesCpy.begin(); it != FilesCpy.end(); it++ ) {
		fi = it->second;

		if ( fi.isDirectory() ) {
			Diff.DirsDeleted.push_back( fi );
		} else {
			Diff.FilesDeleted.push_back( fi );
		}

		/// Remove the file or directory from the list of files
		Files.erase( it->first );
	}

	return Diff;
}